

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

lua_State * lua_newthread(lua_State *L)

{
  StkId pTVar1;
  GCObject *pGVar2;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  pGVar2 = (GCObject *)luaE_newthread(L);
  pTVar1 = L->top;
  (pTVar1->value).gc = pGVar2;
  pTVar1->tt = 8;
  L->top = L->top + 1;
  return (lua_State *)pGVar2;
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  lua_State *L1;
  lua_lock(L);
  luaC_checkGC(L);
  L1 = luaE_newthread(L);
  setthvalue(L, L->top, L1);
  api_incr_top(L);
  lua_unlock(L);
  luai_userstatethread(L, L1);
  return L1;
}